

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O0

int __thiscall FParseContext::GetToken(FParseContext *this,char **sourcep,FParseToken *yylval)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  bool local_a3;
  int local_98;
  int local_94;
  int tokensize;
  int buildup_1;
  char *endp;
  int local_80;
  int buildup;
  int c;
  int toksize;
  char token [80];
  FParseToken *yylval_local;
  char **sourcep_local;
  FParseContext *this_local;
  
  token._72_8_ = yylval;
  while( true ) {
    while( true ) {
      pcVar2 = *sourcep;
      *sourcep = pcVar2 + 1;
      local_80 = (int)*pcVar2;
      iVar4 = isspace(local_80);
      if (iVar4 == 0 || local_80 == 0) break;
      if (local_80 == 10) {
        this->SourceLine = this->SourceLine + 1;
      }
    }
    if (local_80 == 0) {
      return 0;
    }
    iVar4 = isdigit(local_80);
    if (iVar4 != 0) {
      endp._4_4_ = local_80 + -0x30;
      if (local_80 == 0x30) {
        pcVar2 = *sourcep;
        *sourcep = pcVar2 + 1;
        local_80 = (int)*pcVar2;
        if ((local_80 == 0x78) || (local_80 == 0x58)) {
          lVar6 = strtol(*sourcep,sourcep,0x10);
          *(int *)token._72_8_ = (int)lVar6;
          return this->TokenTrans[9];
        }
        *sourcep = *sourcep + -1;
      }
      *sourcep = *sourcep + -1;
      lVar6 = strtol(*sourcep,(char **)&tokensize,10);
      *(int *)token._72_8_ = (int)lVar6;
      if (*_tokensize == '.') {
        dVar7 = strtod(*sourcep,sourcep);
        *(double *)token._72_8_ = dVar7;
        return this->TokenTrans[10];
      }
      *sourcep = _tokensize;
      return this->TokenTrans[9];
    }
    iVar4 = isalpha(local_80);
    if (iVar4 != 0) {
      local_94 = 0;
      c._0_1_ = (undefined1)local_80;
      buildup = 1;
      while( true ) {
        local_a3 = false;
        if (buildup < 0x4f) {
          pcVar2 = *sourcep;
          *sourcep = pcVar2 + 1;
          local_80 = (int)*pcVar2;
          iVar4 = isalnum(local_80);
          local_a3 = iVar4 != 0 || local_80 == 0x5f;
        }
        if (!local_a3) break;
        *(char *)((long)&c + (long)buildup) = (char)local_80;
        buildup = buildup + 1;
      }
      *(undefined1 *)((long)&c + (long)buildup) = 0;
      if (buildup == 0x4f) {
        iVar4 = isalnum(local_80);
        while (iVar4 != 0) {
          pcVar2 = *sourcep;
          *sourcep = pcVar2 + 1;
          local_80 = (int)*pcVar2;
          iVar4 = isalnum(local_80);
        }
      }
      *sourcep = *sourcep + -1;
      uVar5 = (*this->_vptr_FParseContext[2])(this,&c,&local_94);
      if ((uVar5 & 1) != 0) {
        return local_94;
      }
      bVar3 = FindSym(this,(char *)&c,(FParseSymbol **)token._72_8_);
      if (bVar3) {
        *(undefined4 *)token._72_8_ = **(undefined4 **)token._72_8_;
        return this->TokenTrans[9];
      }
      iVar4 = P_FindLineSpecial((char *)&c,(int *)0x0,(int *)0x0);
      *(int *)token._72_8_ = iVar4;
      if (iVar4 != 0) {
        return this->TokenTrans[9];
      }
      strcpy((char *)token._72_8_,(char *)&c);
      return this->TokenTrans[0xd];
    }
    if (local_80 != 0x2f) break;
    pcVar2 = *sourcep;
    *sourcep = pcVar2 + 1;
    cVar1 = *pcVar2;
    if (cVar1 == '*') {
      while( true ) {
        while( true ) {
          pcVar2 = *sourcep;
          *sourcep = pcVar2 + 1;
          cVar1 = *pcVar2;
          if (cVar1 == '*' || cVar1 == '\0') break;
          if (cVar1 == '\n') {
            this->SourceLine = this->SourceLine + 1;
          }
        }
        if (cVar1 == '\0') {
          return 0;
        }
        pcVar2 = *sourcep;
        *sourcep = pcVar2 + 1;
        cVar1 = *pcVar2;
        if (cVar1 == '/') break;
        if (cVar1 == '\0') {
          return 0;
        }
        *sourcep = *sourcep + -1;
      }
    }
    else {
      if (cVar1 != '/') {
        *sourcep = *sourcep + -1;
        return this->TokenTrans[7];
      }
      do {
        pcVar2 = *sourcep;
        *sourcep = pcVar2 + 1;
        cVar1 = *pcVar2;
      } while (cVar1 != '\n' && cVar1 != '\0');
      if (cVar1 == '\n') {
        this->SourceLine = this->SourceLine + 1;
      }
      else if (cVar1 == -1) {
        return 0;
      }
    }
  }
  if (local_80 == 0x22) {
    local_98 = 0;
    while( true ) {
      pcVar2 = *sourcep;
      *sourcep = pcVar2 + 1;
      cVar1 = *pcVar2;
      if (cVar1 == '\"' || cVar1 == '\0') break;
      *(char *)(token._72_8_ + (long)local_98) = cVar1;
      local_98 = local_98 + 1;
    }
    *(undefined1 *)(token._72_8_ + (long)local_98) = 0;
    return this->TokenTrans[0x19];
  }
  if (local_80 == 0x7c) {
    pcVar2 = *sourcep;
    *sourcep = pcVar2 + 1;
    if (*pcVar2 == '=') {
      return this->TokenTrans[0x14];
    }
    *sourcep = *sourcep + -1;
    return this->TokenTrans[1];
  }
  if (local_80 != 0x3c) {
    if (local_80 == 0x3e) {
      pcVar2 = *sourcep;
      *sourcep = pcVar2 + 1;
      if (*pcVar2 != '>') {
        return 0;
      }
      pcVar2 = *sourcep;
      *sourcep = pcVar2 + 1;
      if (*pcVar2 == '=') {
        return this->TokenTrans[0x18];
      }
      *sourcep = *sourcep + -1;
      return 0;
    }
    if (local_80 == 0x23) {
      iVar4 = strncasecmp(*sourcep,"include",7);
      if (iVar4 == 0) {
        *sourcep = *sourcep + 7;
        return this->TokenTrans[0x1a];
      }
      iVar4 = strncasecmp(*sourcep,"define",6);
      if (iVar4 == 0) {
        *sourcep = *sourcep + 6;
        return this->TokenTrans[0x1b];
      }
    }
    switch(local_80) {
    case 0x25:
      return this->TokenTrans[8];
    case 0x26:
      return this->TokenTrans[3];
    default:
      return 0;
    case 0x28:
      return this->TokenTrans[0xb];
    case 0x29:
      return this->TokenTrans[0xc];
    case 0x2a:
      return this->TokenTrans[6];
    case 0x2b:
      return this->TokenTrans[5];
    case 0x2c:
      return this->TokenTrans[0x10];
    case 0x2d:
      return this->TokenTrans[4];
    case 0x3a:
      return this->TokenTrans[0x15];
    case 0x3b:
      return this->TokenTrans[0x16];
    case 0x3d:
      return this->TokenTrans[0x11];
    case 0x5b:
      return this->TokenTrans[0x12];
    case 0x5d:
      return this->TokenTrans[0x13];
    case 0x5e:
      return this->TokenTrans[2];
    case 0x7b:
      return this->TokenTrans[0xf];
    case 0x7d:
      return this->TokenTrans[0xe];
    }
  }
  pcVar2 = *sourcep;
  *sourcep = pcVar2 + 1;
  if (*pcVar2 != '<') {
    return 0;
  }
  pcVar2 = *sourcep;
  *sourcep = pcVar2 + 1;
  if (*pcVar2 == '=') {
    return this->TokenTrans[0x17];
  }
  *sourcep = *sourcep + -1;
  return 0;
}

Assistant:

int FParseContext::GetToken (char *&sourcep, FParseToken *yylval)
{
	char token[80];
	int toksize;
	int c;

loop:
	while (isspace (c = *sourcep++) && c != 0)
	{
		if (c == '\n')
			SourceLine++;
	}

	if (c == 0)
	{
		return 0;
	}
	if (isdigit (c))
	{
		int buildup = c - '0';
		if (c == '0')
		{
			c = *sourcep++;
			if (c == 'x' || c == 'X')
			{
				yylval->val = (int)strtol(sourcep, &sourcep, 16);
				return TokenTrans[NUM];
			}
			else
			{
				sourcep--;
			}
		}
		char *endp;

		sourcep--;
		yylval->val = (int)strtol(sourcep, &endp, 10);
		if (*endp == '.')
		{
			// It's a float
			yylval->fval = strtod(sourcep, &sourcep);
			return TokenTrans[FLOATVAL];
		}
		else
		{
			sourcep = endp;
			return TokenTrans[NUM];
		}
	}
	if (isalpha (c))
	{
		int buildup = 0;
		
		token[0] = c;
		toksize = 1;
		while (toksize < 79 && (isalnum (c = *sourcep++) || c == '_'))
		{
			token[toksize++] = c;
		}
		token[toksize] = 0;
		if (toksize == 79 && isalnum (c))
		{
			while (isalnum (c = *sourcep++))
				;
		}
		sourcep--;
		if (FindToken (token, &buildup))
		{
			return buildup;
		}
		if (FindSym (token, &yylval->symval))
		{
			yylval->val = yylval->symval->Value;
			return TokenTrans[NUM];
		}
		if ((yylval->val = P_FindLineSpecial(token)) != 0)
		{
			return TokenTrans[NUM];
		}
#if __GNUC__ == 4 && __GNUC_MINOR__ == 8
		// Work around GCC 4.8 bug 54570 causing release build crashes.
		asm("" : "+g" (yylval));
#endif
		strcpy (yylval->sym, token);
		return TokenTrans[SYM];
	}
	if (c == '/')
	{
		c = *sourcep++;
		if (c == '*')
		{
			for (;;)
			{
				while ((c = *sourcep++) != '*' && c != 0)
				{
					if (c == '\n')
						SourceLine++;
				}
				if (c == 0)
					return 0;
				if ((c = *sourcep++) == '/')
					goto loop;
				if (c == 0)
					return 0;
				sourcep--;
			}
		}
		else if (c == '/')
		{
			while ((c = *sourcep++) != '\n' && c != 0)
				;
			if (c == '\n')
				SourceLine++;
			else if (c == EOF)
				return 0;
			goto loop;
		}
		else
		{
			sourcep--;
			return TokenTrans[DIVIDE];
		}
	}
	if (c == '"')
	{
		int tokensize = 0;
		while ((c = *sourcep++) != '"' && c != 0)
		{
			yylval->string[tokensize++] = c;
		}
		yylval->string[tokensize] = 0;
		return TokenTrans[STRING];
	}
	if (c == '|')
	{
		c = *sourcep++;
		if (c == '=')
			return TokenTrans[OR_EQUAL];
		sourcep--;
		return TokenTrans[OR];
	}
	if (c == '<')
	{
		c = *sourcep++;
		if (c == '<')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[LSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '>')
	{
		c = *sourcep++;
		if (c == '>')
		{
			c = *sourcep++;
			if (c == '=')
			{
				return TokenTrans[RSHASSIGN];
			}
			sourcep--;
			return 0;
		}
		c--;
		return 0;
	}
	if (c == '#')
	{
		if (!strnicmp(sourcep, "include", 7))
		{
			sourcep+=7;
			return TokenTrans[INCLUDE];
		}
		if (!strnicmp(sourcep, "define", 6))
		{
			sourcep+=6;
			return TokenTrans[DEFINE];
		}
	}
	switch (c)
	{
	case '^': return TokenTrans[XOR];
	case '&': return TokenTrans[AND];
	case '-': return TokenTrans[MINUS];
	case '+': return TokenTrans[PLUS];
	case '*': return TokenTrans[MULTIPLY];
	case '%': return TokenTrans[MODULUS];
	case '(': return TokenTrans[LPAREN];
	case ')': return TokenTrans[RPAREN];
	case ',': return TokenTrans[COMMA];
	case '{': return TokenTrans[LBRACE];
	case '}': return TokenTrans[RBRACE];
	case '=': return TokenTrans[EQUALS];
	case ';': return TokenTrans[SEMICOLON];
	case ':': return TokenTrans[COLON];
	case '[': return TokenTrans[LBRACKET];
	case ']': return TokenTrans[RBRACKET];
	default:  return 0;
	}
}